

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

Generator * __thiscall
kratos::Generator::from_verilog
          (Generator *this,Context *context,string *src_file,string *top_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lib_files,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PortType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PortType>_>_>
          *port_types)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pbVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar3;
  Generator *generator;
  _Base_ptr p_Var4;
  iterator iVar5;
  mapped_type *pmVar6;
  _Rb_tree_node_base *p_Var7;
  UserException *pUVar8;
  pointer filename;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  undefined1 local_2d0 [8];
  ifstream f;
  undefined8 auStack_1e8 [36];
  pointer local_c8;
  _Base_ptr p_Stack_c0;
  undefined1 auStack_b8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  ports;
  undefined1 local_60 [8];
  string src;
  
  src.field_2._8_8_ = lib_files;
  bVar3 = fs::exists((string *)context);
  if (!bVar3) {
    pUVar8 = (UserException *)__cxa_allocate_exception(0x10);
    auStack_b8 = (undefined1  [8])(context->modules_)._M_h._M_buckets;
    ports._M_t._M_impl._0_8_ = (context->modules_)._M_h._M_bucket_count;
    format_str_01.size_ = 0xd;
    format_str_01.data_ = (char *)0x12;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         port_types;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_b8;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_2d0,(detail *)"{0} does not exist",format_str_01,args_01);
    UserException::UserException(pUVar8,(string *)local_2d0);
    __cxa_throw(pUVar8,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  generator = Context::generator((Context *)this,src_file);
  this_00 = &generator->lib_files_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(this_00,((long)(top_name->_M_string_length - (long)(top_name->_M_dataplus)._M_p) >> 5) +
                    1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string_const&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)context);
  std::ifstream::ifstream(local_2d0,(string *)context,_S_in);
  local_60 = (undefined1  [8])&src._M_string_length;
  src._M_dataplus._M_p = (pointer)0x0;
  src._M_string_length._0_1_ = 0;
  std::istream::seekg((long)local_2d0,_S_beg);
  std::istream::tellg();
  std::__cxx11::string::reserve((ulong)local_60);
  std::istream::seekg((long)local_2d0,_S_beg);
  auStack_b8 = (undefined1  [8])0x0;
  ports._M_t._M_impl._0_4_ = 0xffffffff;
  std::__cxx11::string::_M_replace_dispatch<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)local_60,local_60,src._M_dataplus._M_p + (long)local_60,
             *(undefined8 *)((long)auStack_1e8 + *(long *)((long)local_2d0 + -0x18)),0xffffffff);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (generator->lib_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,(top_name->_M_dataplus)._M_p,
             top_name->_M_string_length);
  get_port_from_verilog
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
              *)auStack_b8,generator,(string *)local_60,src_file);
  if (ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Rb_tree_node_base *)&ports)
  {
    p_Var4 = ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_emplace_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&generator->ports_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1));
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::Port>const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
                  *)&generator->vars_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1),
                 (shared_ptr<kratos::Port> *)(p_Var4 + 2));
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != (_Rb_tree_node_base *)&ports);
  }
  filename = (generator->lib_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (generator->lib_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (filename == pbVar1) {
      p_Var7 = *(_Rb_tree_node_base **)(src.field_2._8_8_ + 0x18);
      src.field_2._8_8_ = src.field_2._8_8_ + 8;
      if (p_Var7 != (_Rb_tree_node_base *)src.field_2._8_8_) {
        do {
          iVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&(generator->ports_)._M_t,(key_type *)(p_Var7 + 1));
          if ((_Rb_tree_header *)iVar5._M_node ==
              &(generator->ports_)._M_t._M_impl.super__Rb_tree_header) {
            pUVar8 = (UserException *)__cxa_allocate_exception(0x10);
            local_c8 = *(pointer *)(p_Var7 + 1);
            p_Stack_c0 = p_Var7[1]._M_parent;
            format_str_00.size_ = 0xd;
            format_str_00.data_ = (char *)0x17;
            args_00.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                        )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                          )port_types;
            args_00.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)&local_c8;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (detail *)"unable to find port {0}",format_str_00,args_00);
            UserException::UserException
                      (pUVar8,(string *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count);
            __cxa_throw(pUVar8,&UserException::typeinfo,std::runtime_error::~runtime_error);
          }
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                   ::at(&generator->vars_,(key_type *)(p_Var7 + 1));
          peVar2 = (pmVar6->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          this_01 = (pmVar6->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
          }
          (*(peVar2->super_IRNode)._vptr_IRNode[0x2b])(peVar2,(ulong)p_Var7[2]._M_color);
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
        } while (p_Var7 != (_Rb_tree_node_base *)src.field_2._8_8_);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                   *)auStack_b8);
      if (local_60 != (undefined1  [8])&src._M_string_length) {
        operator_delete((void *)local_60,
                        CONCAT71(src._M_string_length._1_7_,(undefined1)src._M_string_length) + 1);
      }
      std::ifstream::~ifstream(local_2d0);
      return generator;
    }
    bVar3 = fs::exists(filename);
    if (!bVar3) break;
    filename = filename + 1;
  }
  pUVar8 = (UserException *)__cxa_allocate_exception(0x10);
  local_c8 = (filename->_M_dataplus)._M_p;
  p_Stack_c0 = (_Base_ptr)filename->_M_string_length;
  format_str.size_ = 0xd;
  format_str.data_ = (char *)0x12;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
              )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                )port_types;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_c8;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (detail *)"{0} does not exist",format_str,args);
  UserException::UserException
            (pUVar8,(string *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count);
  __cxa_throw(pUVar8,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Generator &Generator::from_verilog(Context *context, const std::string &src_file,
                                   const std::string &top_name,
                                   const std::vector<std::string> &lib_files,
                                   const std::map<std::string, PortType> &port_types) {
    if (!fs::exists(src_file)) throw UserException(::format("{0} does not exist", src_file));

    auto &mod = context->generator(top_name);
    // the src file will be treated a lib file as well
    mod.lib_files_.reserve(1 + lib_files.size());
    mod.lib_files_.emplace_back(src_file);

    std::ifstream f(src_file);
    ::string src;
    // pre-allocate the size
    f.seekg(0, std::ios::end);
    src.reserve(f.tellg());
    f.seekg(0, std::ios::beg);
    src.assign(std::istreambuf_iterator<char>(f), std::istreambuf_iterator<char>());

    mod.lib_files_.insert(mod.lib_files_.end(), lib_files.begin(), lib_files.end());
    // const auto &ports = ;
    const auto ports = get_port_from_verilog(&mod, src, top_name);
    for (auto const &[port_name, port] : ports) {
        mod.ports_.emplace(port_name);
        mod.vars_.emplace(port_name, port);
    }
    // verify the existence of each lib files
    for (auto const &filename : mod.lib_files_) {
        if (!fs::exists(filename)) throw UserException(::format("{0} does not exist", filename));
    }

    // assign port types
    for (auto const &[port_name, port_type] : port_types) {
        if (mod.ports_.find(port_name) == mod.ports_.end())
            throw UserException(::format("unable to find port {0}", port_name));
        std::shared_ptr<Var> &var_p = mod.vars_.at(port_name);
        std::shared_ptr<Port> port_p = std::static_pointer_cast<Port>(var_p);
        port_p->set_port_type(port_type);
    }

    return mod;
}